

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDShared.cpp
# Opt level: O3

Instr * LowererMD::ChangeToWriteBarrierAssign(Instr *assignInstr,Func *func)

{
  IndirOpnd *this;
  ThreadContextInfo *pTVar1;
  RegOpnd *addr;
  code *pcVar2;
  OpndKind OVar3;
  OpndKind OVar4;
  bool bVar5;
  int iVar6;
  undefined4 *puVar7;
  Instr *pIVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  char *message;
  char *error;
  uint lineNumber;
  
  this = (IndirOpnd *)assignInstr->m_dst;
  if (TySize[(this->super_Opnd).m_type] != 8) goto LAB_006509b0;
  pTVar1 = func->topFunc->m_threadContextInfo;
  OVar3 = IR::Opnd::GetKind((Opnd *)this);
  OVar4 = IR::Opnd::GetKind((Opnd *)this);
  if (OVar3 == OpndKindIndir) {
    if (OVar4 != OpndKindIndir) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
      if (!bVar5) goto LAB_00650a22;
      *puVar7 = 0;
    }
    bVar5 = IR::IndirOpnd::HasAddrKind(this);
    if (!bVar5) goto LAB_006508ca;
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    error = "(!dest->AsIndirOpnd()->HasAddrKind())";
    message = "!dest->AsIndirOpnd()->HasAddrKind()";
    lineNumber = 0xfdc;
  }
  else {
    if (OVar4 != OpndKindMemRef) {
LAB_006509b0:
      ChangeToAssign(assignInstr,assignInstr->m_dst->m_type);
      return assignInstr;
    }
    OVar3 = IR::Opnd::GetKind((Opnd *)this);
    if (OVar3 != OpndKindMemRef) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x1ec,"(this->IsMemRefOpnd())","Bad call to AsMemRefOpnd()");
      if (!bVar5) goto LAB_00650a22;
      *puVar7 = 0;
    }
    addr = this->m_baseOpnd;
    if ((((((ulong)addr & 7) != 0 || addr == (RegOpnd *)0x0) ||
         (iVar6 = (*pTVar1->_vptr_ThreadContextInfo[5])(pTVar1),
         addr == (RegOpnd *)CONCAT44(extraout_var,iVar6))) ||
        (iVar6 = (*pTVar1->_vptr_ThreadContextInfo[4])(pTVar1),
        addr == (RegOpnd *)CONCAT44(extraout_var_00,iVar6))) ||
       (iVar6 = (*pTVar1->_vptr_ThreadContextInfo[9])(pTVar1),
       addr == (RegOpnd *)CONCAT44(extraout_var_01,iVar6))) goto LAB_006509b0;
    bVar5 = Memory::Recycler::WBCheckIsRecyclerAddress((char *)addr);
    if (bVar5) goto LAB_006508ca;
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    error = "(Recycler::WBCheckIsRecyclerAddress((char*)destAddr))";
    message = "Recycler::WBCheckIsRecyclerAddress((char*)destAddr)";
    lineNumber = 0xfeb;
  }
  bVar5 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                     ,lineNumber,error,message);
  if (!bVar5) {
LAB_00650a22:
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  *puVar7 = 0;
LAB_006508ca:
  ChangeToAssign(assignInstr,assignInstr->m_dst->m_type);
  if (assignInstr->m_opcode != MOV) {
    return assignInstr;
  }
  bVar5 = IR::Opnd::IsWriteBarrierTriggerableValue(assignInstr->m_src1);
  if (!bVar5) {
    return assignInstr;
  }
  pIVar8 = GenerateWriteBarrier(assignInstr);
  return pIVar8;
}

Assistant:

IR::Instr *
LowererMD::ChangeToWriteBarrierAssign(IR::Instr * assignInstr, const Func* func)
{
#ifdef RECYCLER_WRITE_BARRIER_JIT
    IR::Opnd* dest = assignInstr->GetDst();

    auto threadContextInfo = func->GetTopFunc()->GetThreadContextInfo();
    void* destAddr = nullptr;
    bool isPossibleBarrieredDest = false;

    if (TySize[dest->GetType()] == sizeof(void*))
    {
        if (dest->IsIndirOpnd())
        {
            Assert(!dest->AsIndirOpnd()->HasAddrKind());
            isPossibleBarrieredDest = true;
        }
        else if (dest->IsMemRefOpnd())
        {
            // looks all thread context field access are from MemRefOpnd
            destAddr = (void*)dest->AsMemRefOpnd()->GetMemLoc();
            isPossibleBarrieredDest = destAddr != nullptr
                && ((intptr_t)destAddr % sizeof(void*)) == 0
                && destAddr != (void*)threadContextInfo->GetImplicitCallFlagsAddr()
                && destAddr != (void*)threadContextInfo->GetDisableImplicitFlagsAddr()
                && destAddr != (void*)threadContextInfo->GetBailOutRegisterSaveSpaceAddr();

            if (isPossibleBarrieredDest)
            {
                Assert(Recycler::WBCheckIsRecyclerAddress((char*)destAddr));
            }
        }
    }
#endif

    IR::Instr * instr = ChangeToAssignNoBarrierCheck(assignInstr);

    // Now insert write barrier if necessary
#ifdef RECYCLER_WRITE_BARRIER_JIT
    if (isPossibleBarrieredDest
        && assignInstr->m_opcode == Js::OpCode::MOV // ignore SSE instructions like MOVSD
        && assignInstr->GetSrc1()->IsWriteBarrierTriggerableValue())
    {
        instr = LowererMD::GenerateWriteBarrier(assignInstr);
    }
#endif

    return instr;
}